

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_crypto.c
# Opt level: O0

_Bool i2p_dest_sign(i2p_privkeybuf *priv,uint8_t *buf,size_t sz,uint8_t *sig)

{
  short *in_RDI;
  i2p_dsa *in_stack_00000030;
  uint8_t *in_stack_00000208;
  size_t in_stack_00000210;
  uint8_t *in_stack_00000218;
  i2p_eddsa *in_stack_00000220;
  undefined1 local_1;
  
  if (*in_RDI == 0) {
    local_1 = i2p_dsa_sign(in_stack_00000030,(uint8_t *)priv,(size_t)buf,(uint8_t *)sz);
  }
  else if (*in_RDI == 7) {
    local_1 = i2p_eddsa_sign(in_stack_00000220,in_stack_00000218,in_stack_00000210,in_stack_00000208
                            );
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool i2p_dest_sign(struct i2p_privkeybuf * priv, const uint8_t * buf, size_t sz, uint8_t * sig)
{
  switch(priv->sigtype)
  {
  case EDDSA_KEYTYPE:
    return i2p_eddsa_sign(&priv->eddsa, buf, sz, sig);
  case DSA_KEYTYPE:
    return i2p_dsa_sign(&priv->dsa, buf, sz, sig);
  default:
    return false;
  }
}